

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateBaseInstanceOrVertexAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  bool bVar1;
  spv_const_context psVar2;
  DiagnosticStream *pDVar3;
  AssemblyGrammar *pAVar4;
  reference pEVar5;
  mapped_type *this_00;
  BuiltInsValidator *local_658;
  code *local_650;
  undefined8 local_648;
  type local_640;
  value_type local_4f0;
  uint32_t local_4cc;
  string local_4c8;
  char *local_4a8;
  string local_4a0;
  DiagnosticStream local_480;
  uint32_t local_2a8;
  ExecutionModel local_2a4;
  uint32_t vuid_1;
  ExecutionModel execution_model;
  iterator __end3;
  iterator __begin3;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *__range3;
  string local_268;
  char *local_248;
  string local_240;
  DiagnosticStream local_220;
  uint32_t local_44;
  StorageClass local_40;
  uint32_t vuid;
  StorageClass storage_class;
  uint32_t operand;
  Instruction *referenced_from_inst_local;
  Instruction *referenced_inst_local;
  Instruction *built_in_inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  _storage_class = referenced_from_inst;
  referenced_from_inst_local = referenced_inst;
  referenced_inst_local = built_in_inst;
  built_in_inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  vuid = Decoration::builtin(decoration);
  psVar2 = ValidationState_t::context(this->_);
  bVar1 = spvIsVulkanEnv(psVar2->target_env);
  if (bVar1) {
    local_40 = GetStorageClass(_storage_class);
    if ((local_40 != Max) && (local_40 != Input)) {
      local_44 = 0x1059;
      if (vuid == 0x1149) {
        local_44 = 0x1056;
      }
      ValidationState_t::diag(&local_220,this->_,SPV_ERROR_INVALID_DATA,_storage_class);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_240,this->_,local_44,(char *)0x0);
      pDVar3 = DiagnosticStream::operator<<(&local_220,&local_240);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [28])"Vulkan spec allows BuiltIn ");
      pAVar4 = ValidationState_t::grammar(this->_);
      local_248 = AssemblyGrammar::lookupOperandName(pAVar4,SPV_OPERAND_TYPE_BUILT_IN,vuid);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_248);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [58])0xf2e644);
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_268,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                 referenced_from_inst_local,_storage_class,ExecutionModelMax);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_268);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [2])0xf43b35);
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                ((string *)&__range3,this,_storage_class);
      pDVar3 = DiagnosticStream::operator<<
                         (pDVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&__range3);
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      std::__cxx11::string::~string((string *)&__range3);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_240);
      DiagnosticStream::~DiagnosticStream(&local_220);
      return this_local._4_4_;
    }
    __end3 = std::
             set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
             ::begin(&this->execution_models_);
    _vuid_1 = std::
              set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
              ::end(&this->execution_models_);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&vuid_1), bVar1) {
      pEVar5 = std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator*(&__end3);
      local_2a4 = *pEVar5;
      if (local_2a4 != ExecutionModelVertex) {
        local_2a8 = 0x1058;
        if (vuid == 0x1149) {
          local_2a8 = 0x1055;
        }
        ValidationState_t::diag(&local_480,this->_,SPV_ERROR_INVALID_DATA,_storage_class);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_4a0,this->_,local_2a8,(char *)0x0);
        pDVar3 = DiagnosticStream::operator<<(&local_480,&local_4a0);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [28])"Vulkan spec allows BuiltIn ");
        pAVar4 = ValidationState_t::grammar(this->_);
        local_4a8 = AssemblyGrammar::lookupOperandName(pAVar4,SPV_OPERAND_TYPE_BUILT_IN,vuid);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_4a8);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [47])0xf2d2cd);
        (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                  (&local_4c8,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                   referenced_from_inst_local,_storage_class,local_2a4);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_4c8);
        this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4a0);
        DiagnosticStream::~DiagnosticStream(&local_480);
        return this_local._4_4_;
      }
      std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator++(&__end3);
    }
  }
  if (this->function_id_ == 0) {
    local_4cc = val::Instruction::id(_storage_class);
    this_00 = std::
              map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
              ::operator[](&this->id_to_at_reference_checks_,&local_4cc);
    local_650 = ValidateBaseInstanceOrVertexAtReference;
    local_648 = 0;
    local_658 = this;
    std::
    bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
              (&local_640,(offset_in_BuiltInsValidator_to_subr *)&local_650,&local_658,
               (Decoration *)built_in_inst_local,referenced_inst_local,_storage_class,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::function<spv_result_t(spvtools::val::Instruction_const&)>::
    function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
              ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_4f0,&local_640);
    std::__cxx11::
    list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
    ::push_back(this_00,&local_4f0);
    std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_4f0);
    std::
    _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
    ::~_Bind(&local_640);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateBaseInstanceOrVertexAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  uint32_t operand = (uint32_t)decoration.builtin();
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input) {
      uint32_t vuid = (spv::BuiltIn(operand) == spv::BuiltIn::BaseInstance) ? 4182 : 4185;
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << _.VkErrorID(vuid) << "Vulkan spec allows BuiltIn "
             << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                              operand)
             << " to be only used for variables with Input storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      if (execution_model != spv::ExecutionModel::Vertex) {
        uint32_t vuid = (spv::BuiltIn(operand) == spv::BuiltIn::BaseInstance) ? 4181 : 4184;
        return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
               << _.VkErrorID(vuid) << "Vulkan spec allows BuiltIn "
               << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                                operand)
               << " to be used only with Vertex execution model. "
               << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                   referenced_from_inst, execution_model);
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(
        std::bind(&BuiltInsValidator::ValidateBaseInstanceOrVertexAtReference,
                  this, decoration, built_in_inst, referenced_from_inst,
                  std::placeholders::_1));
  }

  return SPV_SUCCESS;
}